

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain_typed_unittest.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::
ManyNames<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::TestBody
          (ManyNames<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate> *this)

{
  ManyNames<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate> *this_local;
  
  return;
}

Assistant:

TYPED_TEST_P(VerifyCertificateChainSingleRootTest, ManyNames) {
  // TODO(bbe) fix this to run these with correct numbers.
#if 0
  this->RunTest("many-names/ok-all-types.test");
  this->RunTest("many-names/toomany-all-types.test");
  this->RunTest("many-names/toomany-dns-excluded.test");
  this->RunTest("many-names/toomany-dns-permitted.test");
  this->RunTest("many-names/toomany-ips-excluded.test");
  this->RunTest("many-names/toomany-ips-permitted.test");
  this->RunTest("many-names/toomany-dirnames-excluded.test");
  this->RunTest("many-names/toomany-dirnames-permitted.test");
#endif
}